

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugLine::ContentTypeTracker::trackContentType
          (ContentTypeTracker *this,LineNumberEntryFormat ContentType)

{
  if ((int)ContentType < 5) {
    if (ContentType != DW_LNCT_timestamp) {
      if (ContentType != DW_LNCT_size) {
        return;
      }
      this = (ContentTypeTracker *)&this->HasLength;
    }
  }
  else if (ContentType == DW_LNCT_MD5) {
    this = (ContentTypeTracker *)&this->HasMD5;
  }
  else {
    if (ContentType != DW_LNCT_LLVM_source) {
      return;
    }
    this = (ContentTypeTracker *)&this->HasSource;
  }
  this->HasModTime = true;
  return;
}

Assistant:

void DWARFDebugLine::ContentTypeTracker::trackContentType(
    dwarf::LineNumberEntryFormat ContentType) {
  switch (ContentType) {
  case dwarf::DW_LNCT_timestamp:
    HasModTime = true;
    break;
  case dwarf::DW_LNCT_size:
    HasLength = true;
    break;
  case dwarf::DW_LNCT_MD5:
    HasMD5 = true;
    break;
  case dwarf::DW_LNCT_LLVM_source:
    HasSource = true;
    break;
  default:
    // We only care about values we consider optional, and new values may be
    // added in the vendor extension range, so we do not match exhaustively.
    break;
  }
}